

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

DbConnection * __thiscall Config::GetDbConnection(Config *this,char *connection)

{
  bool bVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> *__a;
  ValueType *this_01;
  DbConnection *in_RDI;
  Object conn;
  DbConnection *result;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  DbConnection *in_stack_fffffffffffffe70;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffe78;
  string *psVar3;
  allocator<char> *in_stack_fffffffffffffea0;
  char *in_stack_fffffffffffffea8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *in_stack_fffffffffffffec0;
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [35];
  allocator<char> local_55 [13];
  string local_48 [39];
  undefined1 local_21;
  GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  local_20 [4];
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  operator[]<char_const>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  operator[]<char_const>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetObject(in_stack_fffffffffffffe78);
  local_21 = 0;
  (in_RDI->Pwd).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->Pwd).field_2 + 8) = 0;
  *(undefined8 *)&in_RDI->Pwd = 0;
  (in_RDI->Pwd)._M_string_length = 0;
  (in_RDI->User).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->User).field_2 + 8) = 0;
  *(undefined8 *)&in_RDI->User = 0;
  (in_RDI->User)._M_string_length = 0;
  (in_RDI->Host).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->Host).field_2 + 8) = 0;
  *(undefined8 *)&in_RDI->Host = 0;
  (in_RDI->Host)._M_string_length = 0;
  (in_RDI->Db).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(in_RDI->Db).field_2 + 8) = 0;
  *(undefined8 *)&in_RDI->Db = 0;
  (in_RDI->Db)._M_string_length = 0;
  *(undefined8 *)&in_RDI->Port = 0;
  DbConnection::DbConnection(in_stack_fffffffffffffe70);
  rapidjson::
  GenericObject<false,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
  ::operator[]<char_const>
            ((GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
              *)in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffe70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  std::__cxx11::string::operator=((string *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(local_55);
  rapidjson::
  GenericObject<false,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
  ::operator[]<char_const>
            ((GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
              *)in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffe70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  psVar3 = local_78;
  std::__cxx11::string::operator=((string *)&in_RDI->Host,psVar3);
  std::__cxx11::string::~string(psVar3);
  std::allocator<char>::~allocator(&local_79);
  rapidjson::
  GenericObject<false,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
  ::operator[]<char_const>
            ((GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
              *)in_stack_fffffffffffffe70,
             (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)in_stack_fffffffffffffe70);
  __s = &local_a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,in_stack_fffffffffffffea0);
  std::__cxx11::string::operator=((string *)&in_RDI->Pwd,local_a0);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  __a = (allocator<char> *)
        rapidjson::
        GenericObject<false,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
        ::operator[]<char_const>
                  ((GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                    *)in_stack_fffffffffffffe70,
                   (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)in_stack_fffffffffffffe70);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)__s,__a);
  psVar3 = local_c8;
  std::__cxx11::string::operator=((string *)&in_RDI->User,psVar3);
  std::__cxx11::string::~string(psVar3);
  std::allocator<char>::~allocator(&local_c9);
  bVar1 = rapidjson::
          GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
          ::HasMember((GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                       *)in_stack_fffffffffffffe70,
                      (Ch *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
  if (bVar1) {
    this_01 = rapidjson::
              GenericObject<false,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ::operator[]<char_const>
                        ((GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
                          *)in_stack_fffffffffffffe70,
                         (char *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    uVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetUint(this_01);
    in_RDI->Port = uVar2;
  }
  local_21 = 1;
  rapidjson::
  GenericObject<false,_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_>
  ::~GenericObject(local_20);
  return in_RDI;
}

Assistant:

DbConnection Config::GetDbConnection(const char* connection)
{
    auto conn = Settings["DbConnections"][connection].GetObject();
    DbConnection result = DbConnection();
    result.Db = std::string(conn["Db"].GetString());
    result.Host = std::string(conn["Host"].GetString());
    result.Pwd = std::string(conn["Pwd"].GetString());
    result.User = std::string(conn["User"].GetString());
    if(conn.HasMember("Port"))
    {
        result.Port = conn["Port"].GetUint();
    }
    return result;   
}